

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_colorsetfile_ISSI_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  BYTE BVar1;
  int key;
  char *name;
  PClass *pPVar2;
  PClass *pPVar3;
  bool bVar4;
  FPlayerColorSet local_4c;
  
  key = params[1].i;
  name = params[3].s;
  BVar1 = *(BYTE *)(params + 4);
  local_4c.Name.Index = FName::NameManager::FindName(&FName::NameData,params[2].s,false);
  local_4c.Lump = FWadCollection::CheckNumForName(&Wads,name,0);
  pPVar2 = PClassPlayerPawn::RegistrationInfo.MyClass;
  local_4c.NumExtraRanges = '\0';
  local_4c.RepresentativeColor = BVar1;
  if (key < 0) {
    FScriptPosition::Message(&bag->ScriptPosition,3,"Color set number must not be negative.\n");
    return;
  }
  if (-1 < local_4c.Lump) {
    pPVar3 = *(PClass **)
              ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase + 8);
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)
               (*(code *)**(undefined8 **)
                           &(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_PTypeBase)(info);
      *(PClass **)
       ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
               super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar3;
    }
    bVar4 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar2 && bVar4) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar2) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar4) {
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xa40,
                    "void Handler_colorsetfile_ISSI_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::Insert
              ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
               &info[1].super_PClass.super_PNativeStruct.super_PStruct.Fields,key,&local_4c);
  }
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, colorsetfile, ISSI, PlayerPawn)
{
	PROP_INT_PARM(setnum, 0);
	PROP_STRING_PARM(setname, 1);
	PROP_STRING_PARM(rangefile, 2);
	PROP_INT_PARM(representative_color, 3);

	FPlayerColorSet color;
	color.Name = setname;
	color.Lump = Wads.CheckNumForName(rangefile);
	color.RepresentativeColor = representative_color;
	color.NumExtraRanges = 0;

	if (setnum < 0)
	{
		bag.ScriptPosition.Message(MSG_OPTERROR, "Color set number must not be negative.\n");
	}
	else if (color.Lump >= 0)
	{
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->ColorSets.Insert(setnum, color);
	}
}